

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::TaskSet::add(TaskSet *this,Promise<void> *promise)

{
  Disposer *pDVar1;
  Task *pTVar2;
  Task *pTVar3;
  Disposer *pDVar4;
  Own<kj::TaskSet::Task> task;
  Disposer *local_18;
  Task *local_10;
  
  heap<kj::TaskSet::Task,kj::TaskSet&,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_18,this,(Own<kj::_::PromiseNode> *)promise);
  pDVar4 = (this->tasks).ptr.disposer;
  pTVar3 = (this->tasks).ptr.ptr;
  if (pTVar3 != (Task *)0x0) {
    pTVar3->prev = &local_10->next;
    pDVar1 = (local_10->next).ptr.disposer;
    pTVar2 = (local_10->next).ptr.ptr;
    (local_10->next).ptr.disposer = pDVar4;
    (local_10->next).ptr.ptr = pTVar3;
    (this->tasks).ptr.ptr = (Task *)0x0;
    if (pTVar2 != (Task *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,(_func_int *)
                        ((long)&(pTVar2->super_Event)._vptr_Event +
                        (long)(pTVar2->super_Event)._vptr_Event[-2]));
      pDVar4 = (this->tasks).ptr.disposer;
      pTVar3 = (this->tasks).ptr.ptr;
      goto LAB_00299c6e;
    }
  }
  pTVar3 = (Task *)0x0;
LAB_00299c6e:
  pTVar2 = local_10;
  local_10->prev = &this->tasks;
  local_10 = (Task *)0x0;
  (this->tasks).ptr.disposer = local_18;
  (this->tasks).ptr.ptr = pTVar2;
  if (pTVar3 != (Task *)0x0) {
    (**pDVar4->_vptr_Disposer)
              (pDVar4,(_func_int *)
                      ((long)&(pTVar3->super_Event)._vptr_Event +
                      (long)(pTVar3->super_Event)._vptr_Event[-2]));
    pTVar3 = local_10;
    if (local_10 != (Task *)0x0) {
      local_10 = (Task *)0x0;
      (**local_18->_vptr_Disposer)(local_18,(long)pTVar3 + *(long *)(*(long *)pTVar3 + -0x10));
    }
  }
  return;
}

Assistant:

void TaskSet::add(Promise<void>&& promise) {
  auto task = heap<Task>(*this, kj::mv(promise.node));
  KJ_IF_MAYBE(head, tasks) {
    head->get()->prev = &task->next;
    task->next = kj::mv(tasks);
  }
  task->prev = &tasks;
  tasks = kj::mv(task);
}